

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O0

void __thiscall wasm::RemoveNonJSOpsPass::visitBinary(RemoveNonJSOpsPass *this,Binary *curr)

{
  initializer_list<wasm::Expression_*> __l;
  Name target;
  IString str;
  IString str_00;
  IString str_01;
  IString str_02;
  IString str_03;
  IString str_04;
  IString str_05;
  IString str_06;
  IString str_07;
  pointer this_00;
  Call *expression;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar1;
  allocator<wasm::Expression_*> local_1a1;
  Expression *local_1a0;
  undefined8 local_198;
  iterator local_190;
  size_type local_188;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_180;
  size_t local_168;
  char *pcStack_160;
  _Node_iterator_base<wasm::Name,_true> local_158;
  undefined1 local_150;
  size_t local_148;
  char *local_140;
  Name local_138;
  size_t local_128;
  char *local_120;
  Name local_118;
  size_t local_108;
  char *local_100;
  Name local_f8;
  size_t local_e8;
  char *local_e0;
  Name local_d8;
  size_t local_c8;
  char *local_c0;
  Name local_b8;
  size_t local_a8;
  char *local_a0;
  Name local_98;
  size_t local_88;
  char *local_80;
  Name local_78;
  size_t local_68;
  char *local_60;
  Name local_58;
  size_t local_48;
  char *local_40;
  Name local_38;
  undefined1 auStack_28 [8];
  Name name;
  Binary *curr_local;
  RemoveNonJSOpsPass *this_local;
  
  name.super_IString.str._M_str = (char *)curr;
  wasm::Name::Name((Name *)auStack_28);
  switch(*(undefined4 *)(name.super_IString.str._M_str + 0x10)) {
  case 0xd:
    local_48 = WASM_ROTL32;
    local_40 = DAT_03192c68;
    str_07.str._M_str = DAT_03192c68;
    str_07.str._M_len = WASM_ROTL32;
    wasm::Name::Name(&local_38,str_07);
    wasm::Name::operator=((Name *)auStack_28,&local_38);
    break;
  case 0xe:
    local_68 = WASM_ROTR32;
    local_60 = DAT_03192c88;
    str_06.str._M_str = DAT_03192c88;
    str_06.str._M_len = WASM_ROTR32;
    wasm::Name::Name(&local_58,str_06);
    wasm::Name::operator=((Name *)auStack_28,&local_58);
    break;
  default:
    return;
  case 0x1b:
    local_c8 = WASM_I64_MUL;
    local_c0 = DAT_03192d08;
    str_03.str._M_str = DAT_03192d08;
    str_03.str._M_len = WASM_I64_MUL;
    wasm::Name::Name(&local_b8,str_03);
    wasm::Name::operator=((Name *)auStack_28,&local_b8);
    break;
  case 0x1c:
    local_e8 = WASM_I64_SDIV;
    local_e0 = DAT_03192d18;
    str_02.str._M_str = DAT_03192d18;
    str_02.str._M_len = WASM_I64_SDIV;
    wasm::Name::Name(&local_d8,str_02);
    wasm::Name::operator=((Name *)auStack_28,&local_d8);
    break;
  case 0x1d:
    local_108 = WASM_I64_UDIV;
    local_100 = DAT_03192d28;
    str_01.str._M_str = DAT_03192d28;
    str_01.str._M_len = WASM_I64_UDIV;
    wasm::Name::Name(&local_f8,str_01);
    wasm::Name::operator=((Name *)auStack_28,&local_f8);
    break;
  case 0x1e:
    local_128 = WASM_I64_SREM;
    local_120 = DAT_03192d38;
    str_00.str._M_str = DAT_03192d38;
    str_00.str._M_len = WASM_I64_SREM;
    wasm::Name::Name(&local_118,str_00);
    wasm::Name::operator=((Name *)auStack_28,&local_118);
    break;
  case 0x1f:
    local_148 = WASM_I64_UREM;
    local_140 = DAT_03192d48;
    str.str._M_str = DAT_03192d48;
    str.str._M_len = WASM_I64_UREM;
    wasm::Name::Name(&local_138,str);
    wasm::Name::operator=((Name *)auStack_28,&local_138);
    break;
  case 0x26:
    local_88 = WASM_ROTL64;
    local_80 = DAT_03192c78;
    str_05.str._M_str = DAT_03192c78;
    str_05.str._M_len = WASM_ROTL64;
    wasm::Name::Name(&local_78,str_05);
    wasm::Name::operator=((Name *)auStack_28,&local_78);
    break;
  case 0x27:
    local_a8 = WASM_ROTR64;
    local_a0 = DAT_03192c98;
    str_04.str._M_str = DAT_03192c98;
    str_04.str._M_len = WASM_ROTR64;
    wasm::Name::Name(&local_98,str_04);
    wasm::Name::operator=((Name *)auStack_28,&local_98);
    break;
  case 0x36:
  case 0x43:
    rewriteCopysign(this,(Binary *)name.super_IString.str._M_str);
    return;
  }
  pVar1 = std::
          unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
          ::insert(&this->neededIntrinsics,(value_type *)auStack_28);
  local_158._M_cur = (__node_type *)pVar1.first.super__Node_iterator_base<wasm::Name,_true>._M_cur;
  local_150 = pVar1.second;
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  local_168 = (size_t)auStack_28;
  pcStack_160 = (char *)name.super_IString.str._M_len;
  local_1a0 = *(Expression **)(name.super_IString.str._M_str + 0x18);
  local_198 = *(undefined8 *)(name.super_IString.str._M_str + 0x20);
  local_190 = &local_1a0;
  local_188 = 2;
  std::allocator<wasm::Expression_*>::allocator(&local_1a1);
  __l._M_len = local_188;
  __l._M_array = local_190;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_180,__l,&local_1a1);
  target.super_IString.str._M_str = pcStack_160;
  target.super_IString.str._M_len = local_168;
  expression = Builder::makeCall(this_00,target,&local_180,
                                 (Type)*(uintptr_t *)(name.super_IString.str._M_str + 8),false);
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,(Expression *)expression);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_180);
  std::allocator<wasm::Expression_*>::~allocator(&local_1a1);
  return;
}

Assistant:

void visitBinary(Binary* curr) {
    Name name;
    switch (curr->op) {
      case CopySignFloat32:
      case CopySignFloat64:
        rewriteCopysign(curr);
        return;

      case RotLInt32:
        name = WASM_ROTL32;
        break;
      case RotRInt32:
        name = WASM_ROTR32;
        break;
      case RotLInt64:
        name = WASM_ROTL64;
        break;
      case RotRInt64:
        name = WASM_ROTR64;
        break;
      case MulInt64:
        name = WASM_I64_MUL;
        break;
      case DivSInt64:
        name = WASM_I64_SDIV;
        break;
      case DivUInt64:
        name = WASM_I64_UDIV;
        break;
      case RemSInt64:
        name = WASM_I64_SREM;
        break;
      case RemUInt64:
        name = WASM_I64_UREM;
        break;

      default:
        return;
    }
    neededIntrinsics.insert(name);
    replaceCurrent(
      builder->makeCall(name, {curr->left, curr->right}, curr->type));
  }